

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O1

void bool_linear(vec<BoolView> *x,IntRelType t,IntVar *y)

{
  BoolLinearLE<5> *pBVar1;
  BoolLinearLE<4> *this;
  BoolLinearLE<0> *pBVar2;
  undefined8 extraout_RAX;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  IntView<0> _y;
  IntView<5> _y_00;
  IntView<5> _y_01;
  IntView<4> _y_02;
  IntView<5> _y_03;
  IntView<0> _y_04;
  vec<BoolView> x2;
  vec<BoolView> local_58;
  IntVar *local_48;
  BoolView local_40;
  
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (BoolView *)0x0;
  pvVar5 = (void *)(ulong)x->sz;
  if (x->sz != 0) {
    lVar3 = 0xc;
    pvVar4 = (void *)0x0;
    local_48 = y;
    do {
      local_40.v = *(int *)((long)x->data + lVar3 + -4);
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_40.s = (bool)(*(byte *)((long)&(x->data->super_Var).super_Branching._vptr_Branching +
                                   lVar3) ^ 1);
      vec<BoolView>::push(&local_58,&local_40);
      pvVar4 = (void *)((long)pvVar4 + 1);
      pvVar5 = (void *)(ulong)x->sz;
      lVar3 = lVar3 + 0x10;
      y = local_48;
    } while (pvVar4 < pvVar5);
  }
  switch(t) {
  case IRT_EQ:
    pBVar2 = (BoolLinearLE<0> *)operator_new(0x50);
    _y.a = 1;
    _y.b = 0;
    _y.var = y;
    BoolLinearLE<0>::BoolLinearLE(pBVar2,x,_y);
    pBVar1 = (BoolLinearLE<5> *)operator_new(0x50);
    _y_00._8_8_ = ((ulong)x->sz << 0x20) + 1;
    _y_00.var = y;
    BoolLinearLE<5>::BoolLinearLE(pBVar1,&local_58,_y_00);
    break;
  default:
    bool_linear();
    operator_delete(pvVar5);
    vec<BoolView>::~vec(&local_58);
    _Unwind_Resume(extraout_RAX);
  case IRT_LE:
    pBVar2 = (BoolLinearLE<0> *)operator_new(0x50);
    _y_04.a = 1;
    _y_04.b = 0;
    _y_04.var = y;
    BoolLinearLE<0>::BoolLinearLE(pBVar2,x,_y_04);
    break;
  case IRT_LT:
    this = (BoolLinearLE<4> *)operator_new(0x50);
    _y_02.a = 1;
    _y_02.b = -1;
    _y_02.var = y;
    BoolLinearLE<4>::BoolLinearLE(this,x,_y_02);
    break;
  case IRT_GE:
    pBVar1 = (BoolLinearLE<5> *)operator_new(0x50);
    _y_03._8_8_ = ((long)pvVar5 << 0x20) + 1;
    _y_03.var = y;
    BoolLinearLE<5>::BoolLinearLE(pBVar1,&local_58,_y_03);
    break;
  case IRT_GT:
    pBVar1 = (BoolLinearLE<5> *)operator_new(0x50);
    _y_01._8_8_ = ((ulong)((int)pvVar5 - 1) << 0x20) + 1;
    _y_01.var = y;
    BoolLinearLE<5>::BoolLinearLE(pBVar1,&local_58,_y_01);
  }
  vec<BoolView>::~vec(&local_58);
  return;
}

Assistant:

void bool_linear(vec<BoolView>& x, IntRelType t, IntVar* y) {
	vec<BoolView> x2;
	for (unsigned int i = 0; i < x.size(); i++) {
		x2.push(~x[i]);
	}
	switch (t) {
		case IRT_EQ:
			// sum x_i = y <=> sum x_i <= y /\ sum (1-x_i) <= (-y+x.size())
			new BoolLinearLE<0>(x, IntView<0>(y));
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size()));
			break;
		case IRT_LE:
			// sum x_i <= y
			new BoolLinearLE<0>(x, IntView<0>(y));
			break;
		case IRT_LT:
			// sum x_i < y <=> sum x_i <= (y-1)
			new BoolLinearLE<4>(x, IntView<4>(y, 1, -1));
			break;
		case IRT_GE:
			// sum x_i >= y <=> sum (1-x_i) <= (-y+x.size())
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size()));
			break;
		case IRT_GT:
			// sum x_i > y <=> sum (1-x_i) <= (-y+x.size()-1)
			new BoolLinearLE<5>(x2, IntView<5>(y, 1, x.size() - 1));
			break;
		default:
			CHUFFED_ERROR("Unknown IntRelType %d\n", t);
	}
}